

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigInfo.cpp
# Opt level: O3

deInt32 __thiscall eglu::ConfigInfo::getAttribute(ConfigInfo *this,deUint32 attribute)

{
  InternalError *this_00;
  
  if ((int)attribute < 0x330a) {
    switch(attribute) {
    case 0x3020:
      break;
    case 0x3021:
      this = this + 0x14;
      break;
    case 0x3022:
      this = this + 0xc;
      break;
    case 0x3023:
      this = this + 8;
      break;
    case 0x3024:
      this = this + 4;
      break;
    case 0x3025:
      this = this + 0x34;
      break;
    case 0x3026:
      this = this + 100;
      break;
    case 0x3027:
      this = this + 0x28;
      break;
    case 0x3028:
      this = this + 0x2c;
      break;
    case 0x3029:
      this = this + 0x38;
      break;
    case 0x302a:
      this = this + 0x40;
      break;
    case 0x302b:
    case 0x3030:
    case 0x3038:
    case 0x3041:
switchD_003dbb11_caseD_302b:
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Unknown attribute",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
                 ,0x53);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    case 0x302c:
      this = this + 0x3c;
      break;
    case 0x302d:
      this = this + 0x4c;
      break;
    case 0x302e:
      this = this + 0x50;
      break;
    case 0x302f:
      this = this + 0x54;
      break;
    case 0x3031:
      this = this + 0x60;
      break;
    case 0x3032:
      this = this + 0x5c;
      break;
    case 0x3033:
      this = this + 0x68;
      break;
    case 0x3034:
      this = this + 0x6c;
      break;
    case 0x3035:
      this = this + 0x78;
      break;
    case 0x3036:
      this = this + 0x74;
      break;
    case 0x3037:
      this = this + 0x70;
      break;
    case 0x3039:
      this = this + 0x1c;
      break;
    case 0x303a:
      this = this + 0x20;
      break;
    case 0x303b:
      this = this + 0x48;
      break;
    case 0x303c:
      this = this + 0x44;
      break;
    case 0x303d:
      this = this + 0x10;
      break;
    case 0x303e:
      this = this + 0x18;
      break;
    case 0x303f:
      this = this + 0x24;
      break;
    case 0x3040:
      this = this + 0x58;
      break;
    case 0x3042:
      this = this + 0x30;
      break;
    default:
      if (attribute != 0x3301) goto switchD_003dbb11_caseD_302b;
      this = this + 0x7c;
    }
  }
  else {
    switch(attribute) {
    case 0x3311:
      this = this + 0x80;
      break;
    case 0x3312:
      this = this + 0x84;
      break;
    case 0x3313:
    case 0x3314:
    case 0x3315:
    case 0x3316:
    case 0x3318:
    case 0x3319:
      goto switchD_003dbb11_caseD_302b;
    case 0x3317:
      this = this + 0x88;
      break;
    case 0x331a:
      this = this + 0x90;
      break;
    default:
      if (attribute == 0x330a) {
        this = this + 0x8c;
      }
      else {
        if (attribute != 0x3339) goto switchD_003dbb11_caseD_302b;
        this = this + 0x94;
      }
    }
  }
  return *(deInt32 *)this;
}

Assistant:

deInt32 ConfigInfo::getAttribute (deUint32 attribute) const
{
	switch (attribute)
	{
		case EGL_BUFFER_SIZE:				return bufferSize;
		case EGL_RED_SIZE:					return redSize;
		case EGL_GREEN_SIZE:				return greenSize;
		case EGL_BLUE_SIZE:					return blueSize;
		case EGL_LUMINANCE_SIZE:			return luminanceSize;
		case EGL_ALPHA_SIZE:				return alphaSize;
		case EGL_ALPHA_MASK_SIZE:			return alphaMaskSize;
		case EGL_BIND_TO_TEXTURE_RGB:		return bindToTextureRGB;
		case EGL_BIND_TO_TEXTURE_RGBA:		return bindToTextureRGBA;
		case EGL_COLOR_BUFFER_TYPE:			return colorBufferType;
		case EGL_CONFIG_CAVEAT:				return configCaveat;
		case EGL_CONFIG_ID:					return configId;
		case EGL_CONFORMANT:				return conformant;
		case EGL_DEPTH_SIZE:				return depthSize;
		case EGL_LEVEL:						return level;
		case EGL_MAX_PBUFFER_WIDTH:			return maxPbufferWidth;
		case EGL_MAX_PBUFFER_HEIGHT:		return maxPbufferHeight;
		case EGL_MAX_SWAP_INTERVAL:			return maxSwapInterval;
		case EGL_MIN_SWAP_INTERVAL:			return minSwapInterval;
		case EGL_NATIVE_RENDERABLE:			return nativeRenderable;
		case EGL_NATIVE_VISUAL_ID:			return nativeVisualId;
		case EGL_NATIVE_VISUAL_TYPE:		return nativeVisualType;
		case EGL_RENDERABLE_TYPE:			return renderableType;
		case EGL_SAMPLE_BUFFERS:			return sampleBuffers;
		case EGL_SAMPLES:					return samples;
		case EGL_STENCIL_SIZE:				return stencilSize;
		case EGL_SURFACE_TYPE:				return surfaceType;
		case EGL_TRANSPARENT_TYPE:			return transparentType;
		case EGL_TRANSPARENT_RED_VALUE:		return transparentRedValue;
		case EGL_TRANSPARENT_GREEN_VALUE:	return transparentGreenValue;
		case EGL_TRANSPARENT_BLUE_VALUE:	return transparentBlueValue;

		// EGL_EXT_yuv_surface
		case EGL_YUV_ORDER_EXT:				return yuvOrder;
		case EGL_YUV_NUMBER_OF_PLANES_EXT:	return yuvNumberOfPlanes;
		case EGL_YUV_SUBSAMPLE_EXT:			return yuvSubsample;
		case EGL_YUV_DEPTH_RANGE_EXT:		return yuvDepthRange;
		case EGL_YUV_CSC_STANDARD_EXT:		return yuvCscStandard;
		case EGL_YUV_PLANE_BPP_EXT:			return yuvPlaneBpp;

		// EGL_EXT_pixel_format_float
		case EGL_COLOR_COMPONENT_TYPE_EXT:	return colorComponentType;

		default:							TCU_THROW(InternalError, "Unknown attribute");
	}
}